

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::command_cursor::command_cursor(command_cursor *this,command_cursor *n)

{
  _Elt_pointer ppcVar1;
  size_t sVar2;
  
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>::
  _M_initialize_map((_Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                     *)this,0);
  (this->w)._M_dataplus._M_p = (pointer)&(this->w).field_2;
  (this->w)._M_string_length = 0;
  (this->w).field_2._M_local_buf[0] = '\0';
  ppcVar1 = (n->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar1 ==
      (n->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    this->root = n->root;
    this->idx = 0;
    sVar2 = n->idx + n->root_idx;
  }
  else {
    if (ppcVar1 ==
        (n->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppcVar1 = (n->S).c.
                super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->root = ppcVar1[-1];
    this->idx = 0;
    sVar2 = n->idx;
  }
  this->root_idx = sVar2;
  return;
}

Assistant:

command_cursor::command_cursor(const command_cursor &n) :
        root(n.current()),idx(0)
    {
        if (n.S.empty())
            root_idx = n.root_idx + n.idx;
        else
            root_idx = n.idx;
    }